

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  int iVar1;
  undefined8 uVar2;
  _Bit_type *p_Var3;
  ostream *poVar4;
  undefined4 uVar5;
  uint uVar6;
  bool bVar7;
  ulong uVar8;
  bool bVar9;
  vector<bool,_std::allocator<bool>_> vertexCover;
  Graph graph;
  char local_7d;
  undefined4 local_7c;
  vector<bool,_std::allocator<bool>_> local_78;
  Graph local_50;
  
  bVar9 = false;
  std::ios_base::sync_with_stdio(false);
  uVar5 = 0;
  if (1 < argc) {
    uVar8 = 1;
    local_7c = 0;
    bVar7 = false;
    bVar9 = false;
    do {
      std::__cxx11::string::string((string *)&local_78,argv[uVar8],(allocator *)&local_50);
      uVar2 = std::__cxx11::string::compare((char *)&local_78);
      if ((int)uVar2 == 0) {
        local_7c = (undefined4)CONCAT71((int7)((ulong)uVar2 >> 8),1);
      }
      else {
        iVar1 = std::__cxx11::string::compare((char *)&local_78);
        bVar9 = bVar7;
        if (iVar1 == 0) {
          bVar9 = true;
          bVar7 = bVar9;
        }
      }
      if ((_Bit_iterator *)
          local_78.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
          _M_start.super__Bit_iterator_base._M_p !=
          &local_78.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
           _M_finish) {
        operator_delete(local_78.super__Bvector_base<std::allocator<bool>_>._M_impl.
                        super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p,
                        (ulong)((long)local_78.super__Bvector_base<std::allocator<bool>_>._M_impl.
                                      super__Bvector_impl_data._M_finish.super__Bit_iterator_base.
                                      _M_p + 1));
      }
      uVar8 = uVar8 + 1;
      uVar5 = local_7c;
    } while ((uint)argc != uVar8);
  }
  readGraph(&local_50,(istream *)&std::cin);
  Graph::findVertexCover(&local_78,&local_50,(bool)((byte)uVar5 & 1),bVar9);
  if (local_78.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish
      .super__Bit_iterator_base._M_offset != 0 ||
      local_78.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
      super__Bit_iterator_base._M_p !=
      local_78.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish
      .super__Bit_iterator_base._M_p) {
    uVar6 = 0;
    p_Var3 = local_78.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
             _M_start.super__Bit_iterator_base._M_p;
    do {
      bVar9 = uVar6 == 0x3f;
      uVar6 = uVar6 + 1;
      p_Var3 = p_Var3 + bVar9;
      if (bVar9) {
        uVar6 = 0;
      }
    } while (uVar6 != local_78.super__Bvector_base<std::allocator<bool>_>._M_impl.
                      super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset ||
             p_Var3 != local_78.super__Bvector_base<std::allocator<bool>_>._M_impl.
                       super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p);
  }
  poVar4 = std::ostream::_M_insert<long>((long)&std::cout);
  local_7d = '\n';
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,&local_7d,1);
  if (((long)local_78.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
             _M_finish.super__Bit_iterator_base._M_p -
      (long)local_78.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
            _M_start.super__Bit_iterator_base._M_p) * 8 +
      (ulong)local_78.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
             _M_finish.super__Bit_iterator_base._M_offset != 0) {
    uVar8 = 0;
    do {
      if ((local_78.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
           _M_start.super__Bit_iterator_base._M_p[uVar8 >> 6] >> (uVar8 & 0x3f) & 1) != 0) {
        poVar4 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,(int)uVar8);
        local_7d = ' ';
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,&local_7d,1);
      }
      uVar8 = uVar8 + 1;
    } while (uVar8 < (ulong)local_78.super__Bvector_base<std::allocator<bool>_>._M_impl.
                            super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset +
                     ((long)local_78.super__Bvector_base<std::allocator<bool>_>._M_impl.
                            super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p -
                     (long)local_78.super__Bvector_base<std::allocator<bool>_>._M_impl.
                           super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p) * 8);
  }
  bVar9 = Graph::isVertexCover(&local_50,&local_78);
  if (!bVar9) {
    __assert_fail("graph.isVertexCover(vertexCover)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/crismaz[P]vertex-cover/main.cpp"
                  ,0x30,"int main(int, char **)");
  }
  if (local_78.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
      super__Bit_iterator_base._M_p != (_Bit_type *)0x0) {
    operator_delete(local_78.super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p,
                    (long)local_78.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_end_of_storage -
                    (long)local_78.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
    local_78.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
    super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
    local_78.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
    super__Bit_iterator_base._M_offset = 0;
    local_78.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
    super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
    local_78.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
    super__Bit_iterator_base._M_offset = 0;
    local_78.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
    _M_end_of_storage = (_Bit_pointer)0x0;
  }
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::~vector(&local_50.graph);
  return 0;
}

Assistant:

int main(int argc, char* argv[]) {
    std::ios_base::sync_with_stdio(false);

    bool useLinearProgramming = false, anyLpSolution = false;
    for (int index = 1; index < argc; index++) {
        std::string arg(argv[index]);
        if (arg == "-useLp") {
            useLinearProgramming = true;
        } else if (arg == "-anyLpSolution") {
            anyLpSolution = true;
        }
    }

    Graph graph = readGraph();
    auto vertexCover = graph.findVertexCover(useLinearProgramming, anyLpSolution);

    std::cout << std::count(vertexCover.begin(), vertexCover.end(), true) << '\n';
    for (int i = 0; i < vertexCover.size(); i++) {
        if (vertexCover[i]) {
            std::cout << i << ' ';
        }
    }

    assert(graph.isVertexCover(vertexCover)); // check that a valid vertex cover was found

    return 0;
}